

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue,uint useLowProbCount)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  short lowProbCount_00;
  uint uVar4;
  long lVar5;
  size_t code;
  ulong in_RCX;
  uint *in_RDX;
  uint in_ESI;
  short *in_RDI;
  uint in_R8D;
  int in_R9D;
  size_t errorCode;
  U64 restToBeat;
  short proba;
  U32 lowThreshold;
  short largestP;
  uint largest;
  uint s;
  int stillToDistribute;
  U64 vStep;
  U64 step;
  U64 scale;
  short lowProbCount;
  undefined8 in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  short local_66;
  short local_5e;
  uint local_5c;
  uint local_58;
  int local_54;
  uint local_14;
  ulong local_8;
  
  local_14 = in_ESI;
  if (in_ESI == 0) {
    local_14 = 0xb;
  }
  if (local_14 < 5) {
    local_8 = 0xffffffffffffffff;
  }
  else if (local_14 < 0xd) {
    uVar4 = FSE_minTableLog(in_stack_ffffffffffffff90,
                            (uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (local_14 < uVar4) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      lowProbCount_00 = 1;
      if (in_R9D != 0) {
        lowProbCount_00 = -1;
      }
      bVar3 = (byte)local_14;
      bVar2 = -bVar3 + 0x3e;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RCX & 0xffffffff;
      lVar5 = SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
      local_54 = 1 << (bVar3 & 0x1f);
      local_5c = 0;
      local_5e = 0;
      for (local_58 = 0; local_58 <= in_R8D; local_58 = local_58 + 1) {
        if (in_RDX[local_58] == in_RCX) {
          return 0;
        }
        if (in_RDX[local_58] == 0) {
          in_RDI[local_58] = 0;
        }
        else if ((uint)(in_RCX >> (bVar3 & 0x3f)) < in_RDX[local_58]) {
          local_66 = (short)((ulong)in_RDX[local_58] * lVar5 >> (bVar2 & 0x3f));
          if (local_66 < 8) {
            local_66 = local_66 +
                       (ushort)((1L << (-bVar3 + 0x2a & 0x3f)) *
                                (ulong)FSE_normalizeCount::rtbTable[local_66] <
                               (ulong)in_RDX[local_58] * lVar5 - ((long)local_66 << (bVar2 & 0x3f)))
            ;
          }
          if (local_5e < local_66) {
            local_5e = local_66;
            local_5c = local_58;
          }
          in_RDI[local_58] = local_66;
          local_54 = local_54 - local_66;
        }
        else {
          in_RDI[local_58] = lowProbCount_00;
          local_54 = local_54 + -1;
        }
      }
      if (-local_54 < (int)in_RDI[local_5c] >> 1) {
        in_RDI[local_5c] = in_RDI[local_5c] + (short)local_54;
      }
      else {
        code = FSE_normalizeM2(in_RDI,local_14,in_RDX,in_RCX,in_R8D,lowProbCount_00);
        uVar4 = ERR_isError(code);
        if (uVar4 != 0) {
          return code;
        }
      }
      local_8 = (ulong)local_14;
    }
  }
  else {
    local_8 = 0xffffffffffffffd4;
  }
  return local_8;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue, unsigned useLowProbCount)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        short const lowProbCount = useLowProbCount ? -1 : 1;
        U64 const scale = 62 - tableLog;
        U64 const step = ZSTD_div64((U64)1<<62, (U32)total);   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = lowProbCount;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue, lowProbCount);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}